

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool re2::IsValidUTF8(StringPiece *s,RegexpStatus *status)

{
  bool bVar1;
  int iVar2;
  Rune local_34;
  undefined1 auStack_30 [4];
  Rune r;
  StringPiece t;
  RegexpStatus *status_local;
  StringPiece *s_local;
  
  _auStack_30 = s->data_;
  t.data_ = (const_pointer)s->size_;
  t.size_ = (size_type)status;
  do {
    bVar1 = StringPiece::empty((StringPiece *)auStack_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return true;
    }
    iVar2 = StringPieceToRune(&local_34,(StringPiece *)auStack_30,(RegexpStatus *)t.size_);
  } while (-1 < iVar2);
  return false;
}

Assistant:

static bool IsValidUTF8(const StringPiece& s, RegexpStatus* status) {
  StringPiece t = s;
  Rune r;
  while (!t.empty()) {
    if (StringPieceToRune(&r, &t, status) < 0)
      return false;
  }
  return true;
}